

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rplcons.c
# Opt level: O0

LispPTR N_OP_rplcons(LispPTR list,LispPTR item)

{
  LispPTR item_local;
  LispPTR list_local;
  
  if ((*(ushort *)((ulong)(MDStypetbl + (list >> 9)) ^ 2) & 0x7ff) == 5) {
    item_local = cons(item,0);
    N_OP_rplacd(list,item_local);
  }
  else {
    MachineState.errorexit = 1;
    item_local = 0xffffffff;
    MachineState.tosvalue = item;
  }
  return item_local;
}

Assistant:

LispPTR N_OP_rplcons(LispPTR list, LispPTR item) {
#ifndef NEWCDRCODING
  struct conspage *conspage;
  ConsCell *new_cell;
  ConsCell *list68k;
  LispPTR page;
#endif

  if (!Listp(list)) ERROR_EXIT(item);

/* There are some rest Cell and "list" must be ONPAGE cdr_coded */
#ifndef NEWCDRCODING
  page = POINTER_PAGE(list);
  list68k = (ConsCell *)NativeAligned4FromLAddr(list);

  if ((GetCONSCount(page) != 0) && (list68k->cdr_code > CDR_MAXINDIRECT)) {
    GCLOOKUP(item, ADDREF);
    GCLOOKUP(cdr(list), DELREF);

    conspage = (struct conspage *)NativeAligned4FromLPage(page);
    new_cell = (ConsCell *)GetNewCell_68k(conspage);

    conspage->count--;
    conspage->next_cell = ((freecons *)new_cell)->next_free;

    new_cell->car_field = item;
    new_cell->cdr_code = CDR_NIL;

    ListpDTD->dtd_cnt0++;

    list68k->cdr_code = CDR_ONPAGE | ((LAddrFromNative(new_cell) & 0xff) >> 1);

    return (LAddrFromNative(new_cell));

  } else
#endif /* ndef NEWCDRCODING */
  {
    N_OP_rplacd(list, item = cons(item, NIL_PTR));
    return (item);
  }
}